

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orderedOffsetTable.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_orderedOffsetTable_findValueWithOffset
          (sysbvm_context_t *context,sysbvm_tuple_t table,uint32_t offset)

{
  uint uVar1;
  size_t sVar2;
  uint32_t entryPC;
  uint32_t middle;
  intptr_t bestFound;
  uint32_t upper;
  uint32_t lower;
  uint32_t *offsets;
  size_t size;
  sysbvm_orderedOffsetTable_t *offsetTable;
  uint32_t offset_local;
  sysbvm_tuple_t table_local;
  sysbvm_context_t *context_local;
  
  if (table == 0) {
    context_local = (sysbvm_context_t *)0x0;
  }
  else if (*(long *)(table + 0x10) == 0) {
    context_local = (sysbvm_context_t *)0x0;
  }
  else {
    sVar2 = sysbvm_tuple_getSizeInSlots(*(sysbvm_tuple_t *)(table + 0x18));
    bestFound._4_4_ = 0;
    _entryPC = 0xffffffffffffffff;
    uVar1 = (uint)sVar2;
    while (bestFound._0_4_ = uVar1, bestFound._4_4_ < (uint)bestFound) {
      uVar1 = bestFound._4_4_ + ((uint)bestFound - bestFound._4_4_ >> 1);
      if (*(uint *)(*(long *)(table + 0x10) + 0x10 + (ulong)uVar1 * 4) <= offset) {
        bestFound._4_4_ = uVar1 + 1;
        _entryPC = (ulong)uVar1;
        uVar1 = (uint)bestFound;
      }
    }
    if (((long)_entryPC < 0) ||
       (sVar2 = sysbvm_array_getSize(*(sysbvm_tuple_t *)(table + 0x18)), sVar2 <= _entryPC)) {
      context_local = (sysbvm_context_t *)0x0;
    }
    else {
      context_local = *(sysbvm_context_t **)(*(long *)(table + 0x18) + 0x10 + _entryPC * 8);
    }
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_orderedOffsetTable_findValueWithOffset(sysbvm_context_t *context, sysbvm_tuple_t table, uint32_t offset)
{
    (void)context;
    if(!table)
        return SYSBVM_NULL_TUPLE;

    sysbvm_orderedOffsetTable_t *offsetTable = (sysbvm_orderedOffsetTable_t*)table;
    if(!offsetTable->keys)
        return SYSBVM_NULL_TUPLE;

    size_t size = sysbvm_tuple_getSizeInSlots(offsetTable->values);
    uint32_t *offsets = (uint32_t*)SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(offsetTable->keys)->bytes;

    // Binary search
    uint32_t lower = 0;
    uint32_t upper = size;
    intptr_t bestFound = -1;
    while(lower < upper)
    {
        uint32_t middle = lower + (upper - lower) / 2;
        uint32_t entryPC = offsets[middle];
        if(entryPC <= offset)
        {
            lower = middle + 1;
            bestFound = middle;
        }
        else
        {
            upper = middle;
        }
    }

    if(bestFound < 0 || (size_t)bestFound >= sysbvm_array_getSize(offsetTable->values))
        return SYSBVM_NULL_TUPLE;

    return SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(offsetTable->values)->pointers[bestFound];
}